

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult_table_verify(int n,int w)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if ((n & 1U) == 0) {
    pcVar1 = "test condition failed: ((n) & 1) == 1";
    uStack_10 = 0x78;
  }
  else if (n < -7) {
    pcVar1 = "test condition failed: (n) >= -((1 << ((w)-1)) - 1)";
    uStack_10 = 0x79;
  }
  else {
    if (n < 8) {
      return;
    }
    pcVar1 = "test condition failed: (n) <= ((1 << ((w)-1)) - 1)";
    uStack_10 = 0x7a;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_verify(int n, int w) {
    (void)n;
    (void)w;
    VERIFY_CHECK(((n) & 1) == 1);
    VERIFY_CHECK((n) >= -((1 << ((w)-1)) - 1));
    VERIFY_CHECK((n) <=  ((1 << ((w)-1)) - 1));
}